

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3ColumnsFromExprList(Parse *pParse,ExprList *pEList,i16 *pnCol,Column **paCol)

{
  byte *pbVar1;
  uint uVar2;
  sqlite3 *db;
  Table *pTVar3;
  i16 *piVar4;
  ExprList_item *pEVar5;
  ulong uVar6;
  u8 uVar7;
  ushort uVar8;
  u32 uVar9;
  uint uVar10;
  Column *pCVar11;
  Expr *pEVar12;
  Column *pCVar13;
  byte *pKey;
  void *pvVar14;
  undefined1 *puVar15;
  Column **extraout_RAX;
  Column **ppCVar16;
  ulong uVar17;
  byte bVar18;
  char *zIn;
  long lVar19;
  u32 cnt;
  ulong local_80;
  Column **local_78;
  ulong local_70;
  Column *local_68;
  i16 *local_60;
  ExprList_item *local_58;
  ExprList_item *local_50;
  Hash ht;
  
  db = pParse->db;
  ht.ht = (_ht *)0x0;
  ht.htsize = 0;
  ht.count = 0;
  ht.first = (HashElem *)0x0;
  local_78 = paCol;
  if (pEList == (ExprList *)0x0) {
    pCVar11 = (Column *)0x0;
    uVar10 = 0;
  }
  else {
    uVar2 = pEList->nExpr;
    pCVar11 = (Column *)sqlite3DbMallocZero(db,(long)(int)uVar2 << 4);
    uVar10 = 0x7fff;
    if ((int)uVar2 < 0x7fff) {
      uVar10 = uVar2;
    }
  }
  *pnCol = (i16)uVar10;
  *local_78 = pCVar11;
  local_58 = pEList->a;
  local_80 = (ulong)uVar10;
  if ((int)uVar10 < 1) {
    local_80 = 0;
  }
  uVar17 = 0;
  local_68 = pCVar11;
  local_60 = pnCol;
  do {
    uVar6 = local_80;
    if ((uVar17 == local_80) || (uVar6 = uVar17, pParse->nErr != 0)) {
      local_80 = uVar6;
      sqlite3HashClear(&ht);
      piVar4 = local_60;
      pCVar11 = local_68;
      ppCVar16 = extraout_RAX;
      if (pParse->nErr != 0) {
        uVar17 = local_80 & 0xffffffff;
        for (lVar19 = 0; uVar17 << 4 != lVar19; lVar19 = lVar19 + 0x10) {
          sqlite3DbFree(db,*(void **)((long)&pCVar11->zCnName + lVar19));
        }
        sqlite3DbFree(db,pCVar11);
        *local_78 = (Column *)0x0;
        *piVar4 = 0;
        ppCVar16 = local_78;
      }
      return (int)ppCVar16;
    }
    local_50 = local_58 + uVar17;
    zIn = local_58[uVar17].zEName;
    local_70 = uVar17;
    if ((zIn == (char *)0x0) || (((local_50->fg).field_0x1 & 3) != 0)) {
      for (pEVar12 = sqlite3ExprSkipCollateAndLikely(local_50->pExpr); uVar7 = pEVar12->op,
          uVar7 == 0x8d; pEVar12 = pEVar12->pRight) {
      }
      if (uVar7 == ';') {
        pCVar13 = (Column *)&pEVar12->u;
LAB_0016fff9:
        zIn = pCVar13->zCnName;
      }
      else if (((uVar7 == 0xa7) && ((pEVar12->flags & 0x3000000) == 0)) &&
              (pTVar3 = (pEVar12->y).pTab, pTVar3 != (Table *)0x0)) {
        uVar8 = pEVar12->iColumn;
        if ((short)uVar8 < 0) {
          uVar8 = pTVar3->iPKey;
          zIn = "rowid";
          if ((short)uVar8 < 0) goto LAB_00170001;
        }
        pCVar13 = pTVar3->aCol + uVar8;
        goto LAB_0016fff9;
      }
      if (zIn != (char *)0x0) goto LAB_00170001;
LAB_0017000d:
      pKey = (byte *)sqlite3MPrintf(db,"column%d",(ulong)((int)local_70 + 1));
    }
    else {
LAB_00170001:
      uVar9 = sqlite3IsTrueOrFalse(zIn);
      if (uVar9 != 0) goto LAB_0017000d;
      pKey = (byte *)sqlite3DbStrDup(db,zIn);
    }
    cnt = 0;
    while ((pKey != (byte *)0x0 &&
           (pvVar14 = sqlite3HashFind(&ht,(char *)pKey), pvVar14 != (void *)0x0))) {
      if ((*(byte *)((long)pvVar14 + 0x11) & 0x80) != 0) {
        pbVar1 = (byte *)((long)&pCVar11->colFlags + 1);
        *pbVar1 = *pbVar1 | 4;
      }
      uVar10 = sqlite3Strlen30((char *)pKey);
      if (uVar10 == 0) {
        uVar10 = 0;
      }
      else {
        uVar17 = (ulong)uVar10;
        do {
          if (uVar17 < 2) {
            bVar18 = *pKey;
            uVar17 = 0;
            break;
          }
          uVar17 = uVar17 - 1;
          bVar18 = pKey[uVar17 & 0xffffffff];
        } while (0xfffffffffffffff5 < (ulong)bVar18 - 0x3a);
        if (bVar18 == 0x3a) {
          uVar10 = (uint)uVar17;
        }
      }
      cnt = cnt + 1;
      pKey = (byte *)sqlite3MPrintf(db,"%.*z:%u",(ulong)uVar10,pKey);
      sqlite3ProgressCheck(pParse);
      if (3 < cnt) {
        sqlite3_randomness(4,&cnt);
      }
    }
    pCVar11->zCnName = (char *)pKey;
    uVar7 = sqlite3StrIHash((char *)pKey);
    pEVar5 = local_50;
    pCVar11->hName = uVar7;
    if (((local_50->fg).field_0x2 & 1) != 0) {
      pbVar1 = (byte *)((long)&pCVar11->colFlags + 1);
      *pbVar1 = *pbVar1 | 4;
    }
    if ((pKey != (byte *)0x0) &&
       (puVar15 = (undefined1 *)sqlite3HashInsert(&ht,(char *)pKey,local_50),
       (ExprList_item *)puVar15 == pEVar5)) {
      sqlite3OomFault(db);
    }
    uVar17 = local_70 + 1;
    pCVar11 = pCVar11 + 1;
  } while( true );
}

Assistant:

SQLITE_PRIVATE int sqlite3ColumnsFromExprList(
  Parse *pParse,          /* Parsing context */
  ExprList *pEList,       /* Expr list from which to derive column names */
  i16 *pnCol,             /* Write the number of columns here */
  Column **paCol          /* Write the new column list here */
){
  sqlite3 *db = pParse->db;   /* Database connection */
  int i, j;                   /* Loop counters */
  u32 cnt;                    /* Index added to make the name unique */
  Column *aCol, *pCol;        /* For looping over result columns */
  int nCol;                   /* Number of columns in the result set */
  char *zName;                /* Column name */
  int nName;                  /* Size of name in zName[] */
  Hash ht;                    /* Hash table of column names */
  Table *pTab;

  sqlite3HashInit(&ht);
  if( pEList ){
    nCol = pEList->nExpr;
    aCol = sqlite3DbMallocZero(db, sizeof(aCol[0])*nCol);
    testcase( aCol==0 );
    if( NEVER(nCol>32767) ) nCol = 32767;
  }else{
    nCol = 0;
    aCol = 0;
  }
  assert( nCol==(i16)nCol );
  *pnCol = nCol;
  *paCol = aCol;

  for(i=0, pCol=aCol; i<nCol && !pParse->nErr; i++, pCol++){
    struct ExprList_item *pX = &pEList->a[i];
    struct ExprList_item *pCollide;
    /* Get an appropriate name for the column
    */
    if( (zName = pX->zEName)!=0 && pX->fg.eEName==ENAME_NAME ){
      /* If the column contains an "AS <name>" phrase, use <name> as the name */
    }else{
      Expr *pColExpr = sqlite3ExprSkipCollateAndLikely(pX->pExpr);
      while( ALWAYS(pColExpr!=0) && pColExpr->op==TK_DOT ){
        pColExpr = pColExpr->pRight;
        assert( pColExpr!=0 );
      }
      if( pColExpr->op==TK_COLUMN
       && ALWAYS( ExprUseYTab(pColExpr) )
       && ALWAYS( pColExpr->y.pTab!=0 )
      ){
        /* For columns use the column name name */
        int iCol = pColExpr->iColumn;
        pTab = pColExpr->y.pTab;
        if( iCol<0 ) iCol = pTab->iPKey;
        zName = iCol>=0 ? pTab->aCol[iCol].zCnName : "rowid";
      }else if( pColExpr->op==TK_ID ){
        assert( !ExprHasProperty(pColExpr, EP_IntValue) );
        zName = pColExpr->u.zToken;
      }else{
        /* Use the original text of the column expression as its name */
        assert( zName==pX->zEName );  /* pointer comparison intended */
      }
    }
    if( zName && !sqlite3IsTrueOrFalse(zName) ){
      zName = sqlite3DbStrDup(db, zName);
    }else{
      zName = sqlite3MPrintf(db,"column%d",i+1);
    }

    /* Make sure the column name is unique.  If the name is not unique,
    ** append an integer to the name so that it becomes unique.
    */
    cnt = 0;
    while( zName && (pCollide = sqlite3HashFind(&ht, zName))!=0 ){
      if( pCollide->fg.bUsingTerm ){
        pCol->colFlags |= COLFLAG_NOEXPAND;
      }
      nName = sqlite3Strlen30(zName);
      if( nName>0 ){
        for(j=nName-1; j>0 && sqlite3Isdigit(zName[j]); j--){}
        if( zName[j]==':' ) nName = j;
      }
      zName = sqlite3MPrintf(db, "%.*z:%u", nName, zName, ++cnt);
      sqlite3ProgressCheck(pParse);
      if( cnt>3 ){
        sqlite3_randomness(sizeof(cnt), &cnt);
      }
    }
    pCol->zCnName = zName;
    pCol->hName = sqlite3StrIHash(zName);
    if( pX->fg.bNoExpand ){
      pCol->colFlags |= COLFLAG_NOEXPAND;
    }
    sqlite3ColumnPropertiesFromName(0, pCol);
    if( zName && sqlite3HashInsert(&ht, zName, pX)==pX ){
      sqlite3OomFault(db);
    }
  }
  sqlite3HashClear(&ht);
  if( pParse->nErr ){
    for(j=0; j<i; j++){
      sqlite3DbFree(db, aCol[j].zCnName);
    }
    sqlite3DbFree(db, aCol);
    *paCol = 0;
    *pnCol = 0;
    return pParse->rc;
  }
  return SQLITE_OK;
}